

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3Fts3ExprFree(Fts3Expr *pDel)

{
  Fts3Phrase *pFVar1;
  Fts3MultiSegReader *pCsr;
  Fts3Expr *pFVar2;
  Fts3Expr *pFVar3;
  long lVar4;
  Fts3MultiSegReader **ppFVar5;
  
  if (pDel != (Fts3Expr *)0x0) {
    do {
      pFVar3 = pDel->pLeft;
      if (pFVar3 == (Fts3Expr *)0x0) {
        if (pDel->pRight == (Fts3Expr *)0x0) break;
        pFVar3 = pDel->pRight;
      }
      pDel = pFVar3;
    } while (pFVar3 != (Fts3Expr *)0x0);
  }
joined_r0x001bcb38:
  do {
    do {
      pFVar3 = pDel;
      if (pFVar3 == (Fts3Expr *)0x0) {
        return;
      }
      pDel = pFVar3->pParent;
      pFVar1 = pFVar3->pPhrase;
      if (pFVar1 != (Fts3Phrase *)0x0) {
        sqlite3_free((pFVar1->doclist).aAll);
        if ((pFVar1->doclist).bFreeList != 0) {
          sqlite3_free((pFVar1->doclist).pList);
        }
        *(undefined8 *)&(pFVar1->doclist).bFreeList = 0;
        (pFVar1->doclist).pList = (char *)0x0;
        (pFVar1->doclist).pNextDocid = (char *)0x0;
        (pFVar1->doclist).iDocid = 0;
        (pFVar1->doclist).aAll = (char *)0x0;
        *(undefined8 *)&(pFVar1->doclist).nAll = 0;
        *(undefined8 *)&(pFVar1->doclist).nList = 0;
        if (0 < pFVar1->nToken) {
          ppFVar5 = &pFVar1->aToken[0].pSegcsr;
          lVar4 = 0;
          do {
            pCsr = *ppFVar5;
            sqlite3Fts3SegReaderFinish(pCsr);
            sqlite3_free(pCsr);
            *ppFVar5 = (Fts3MultiSegReader *)0x0;
            lVar4 = lVar4 + 1;
            ppFVar5 = ppFVar5 + 5;
          } while (lVar4 < pFVar1->nToken);
        }
      }
      sqlite3_free(pFVar3->aMI);
      sqlite3_free(pFVar3);
    } while (((pDel == (Fts3Expr *)0x0) || (pFVar3 != pDel->pLeft)) ||
            (pFVar3 = pDel->pRight, pFVar3 == (Fts3Expr *)0x0));
    do {
      pFVar2 = pFVar3->pLeft;
      if (pFVar3->pLeft == (Fts3Expr *)0x0) {
        pDel = pFVar3;
        if (pFVar3->pRight == (Fts3Expr *)0x0) goto joined_r0x001bcb38;
        pFVar2 = pFVar3->pRight;
      }
      pFVar3 = pFVar2;
    } while (pFVar3 != (Fts3Expr *)0x0);
    pDel = (Fts3Expr *)0x0;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3ExprFree(Fts3Expr *pDel){
  Fts3Expr *p;
  assert( pDel==0 || pDel->pParent==0 );
  for(p=pDel; p && (p->pLeft||p->pRight); p=(p->pLeft ? p->pLeft : p->pRight)){
    assert( p->pParent==0 || p==p->pParent->pRight || p==p->pParent->pLeft );
  }
  while( p ){
    Fts3Expr *pParent = p->pParent;
    fts3FreeExprNode(p);
    if( pParent && p==pParent->pLeft && pParent->pRight ){
      p = pParent->pRight;
      while( p && (p->pLeft || p->pRight) ){
        assert( p==p->pParent->pRight || p==p->pParent->pLeft );
        p = (p->pLeft ? p->pLeft : p->pRight);
      }
    }else{
      p = pParent;
    }
  }
}